

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

int Cnf_DataWriteAndClauses(void *p,Cnf_Dat_t *pCnf)

{
  lit lVar1;
  int iVar2;
  lit local_38;
  lit local_34;
  int Lit;
  int i;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf_local;
  void *p_local;
  
  local_34 = 0;
  pObj = (Aig_Obj_t *)p;
  pSat = (sat_solver *)pCnf;
  pCnf_local = (Cnf_Dat_t *)p;
  while( true ) {
    lVar1 = local_34;
    iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(*(long *)pSat + 0x18));
    if (iVar2 <= lVar1) {
      return 1;
    }
    _Lit = Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)pSat + 0x18),local_34);
    local_38 = toLitCond(*(int *)(*(long *)(pSat->Mem).BookMarkE +
                                 (long)*(int *)((long)_Lit + 0x24) * 4),0);
    iVar2 = sat_solver_addclause((sat_solver *)pObj,&local_38,&local_34);
    if (iVar2 == 0) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int Cnf_DataWriteAndClauses( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver * pSat = (sat_solver *)p;
    Aig_Obj_t * pObj;
    int i, Lit;
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
    {
        Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
        if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            return 0;
    }
    return 1;
}